

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O3

int archive_write_set_format_7zip(archive *_a)

{
  int iVar1;
  undefined4 *puVar2;
  int iVar3;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_7zip");
  iVar3 = -0x1e;
  if (iVar1 != -0x1e) {
    if (*(code **)&_a[2].file_count != (code *)0x0) {
      (**(code **)&_a[2].file_count)(_a);
    }
    puVar2 = (undefined4 *)calloc(1,0xf140);
    if (puVar2 == (undefined4 *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate 7-Zip data");
    }
    else {
      *puVar2 = 0xffffffff;
      __archive_rb_tree_init
                ((archive_rb_tree *)(puVar2 + 0x3c4c),&archive_write_set_format_7zip::rb_ops);
      iVar3 = 0;
      *(undefined8 *)(puVar2 + 0x3c44) = 0;
      *(undefined4 **)(puVar2 + 0x3c46) = puVar2 + 0x3c44;
      *(undefined8 *)(puVar2 + 0x3c48) = 0;
      *(undefined4 **)(puVar2 + 0x3c4a) = puVar2 + 0x3c48;
      *(undefined8 *)(puVar2 + 0x20) = 0x600030101;
      *(undefined4 **)&_a[1].current_codepage = puVar2;
      _a[1].sconv = (archive_string_conv *)0x16fe80;
      _a[2].vtable = (archive_vtable_conflict *)_7z_options;
      _a[2].archive_format_name = (char *)_7z_write_header;
      *(code **)&_a[2].compression_code = _7z_write_data;
      *(code **)&_a[2].archive_format = _7z_finish_entry;
      _a[2].compression_name = (char *)_7z_close;
      *(code **)&_a[2].file_count = _7z_free;
      _a->archive_format = 0xe0000;
      _a->archive_format_name = "7zip";
    }
  }
  return iVar3;
}

Assistant:

int
archive_write_set_format_7zip(struct archive *_a)
{
	static const struct archive_rb_tree_ops rb_ops = {
		file_cmp_node, file_cmp_key
	};
	struct archive_write *a = (struct archive_write *)_a;
	struct _7zip *zip;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_7zip");

	/* If another format was already registered, unregister it. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	zip = calloc(1, sizeof(*zip));
	if (zip == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate 7-Zip data");
		return (ARCHIVE_FATAL);
	}
	zip->temp_fd = -1;
	__archive_rb_tree_init(&(zip->rbtree), &rb_ops);
	file_init_register(zip);
	file_init_register_empty(zip);

	/* Set default compression type and its level. */
#if HAVE_LZMA_H
	zip->opt_compression = _7Z_LZMA1;
#elif defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
	zip->opt_compression = _7Z_BZIP2;
#elif defined(HAVE_ZLIB_H)
	zip->opt_compression = _7Z_DEFLATE;
#else
	zip->opt_compression = _7Z_COPY;
#endif
	zip->opt_compression_level = 6;

	a->format_data = zip;

	a->format_name = "7zip";
	a->format_options = _7z_options;
	a->format_write_header = _7z_write_header;
	a->format_write_data = _7z_write_data;
	a->format_finish_entry = _7z_finish_entry;
	a->format_close = _7z_close;
	a->format_free = _7z_free;
	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	a->archive.archive_format_name = "7zip";

	return (ARCHIVE_OK);
}